

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2.cc
# Opt level: O1

void BLAKE2B256(uint8_t *data,size_t len,uint8_t *out)

{
  BLAKE2B_CTX ctx;
  BLAKE2B_CTX local_f8;
  
  memset(&local_f8.t_low,0,0x98);
  local_f8.h[1] = 0xbb67ae8584caa73b;
  local_f8.h[2] = 0x3c6ef372fe94f82b;
  local_f8.h[3] = 0xa54ff53a5f1d36f1;
  local_f8.h[4] = 0x510e527fade682d1;
  local_f8.h[5] = 0x9b05688c2b3e6c1f;
  local_f8.h[6] = 0x1f83d9abfb41bd6b;
  local_f8.h[7] = 0x5be0cd19137e2179;
  local_f8.h[0] = 0x6a09e667f2bdc928;
  BLAKE2B256_Update(&local_f8,data,len);
  if (local_f8.block_used != 0x80) {
    memset(local_f8.block + local_f8.block_used,0,0x80 - local_f8.block_used);
  }
  blake2b_transform(&local_f8,local_f8.block,local_f8.block_used,1);
  *(uint64_t *)(out + 0x10) = local_f8.h[2];
  *(uint64_t *)(out + 0x18) = local_f8.h[3];
  *(uint64_t *)out = local_f8.h[0];
  *(uint64_t *)(out + 8) = local_f8.h[1];
  return;
}

Assistant:

void BLAKE2B256(const uint8_t *data, size_t len,
                uint8_t out[BLAKE2B256_DIGEST_LENGTH]) {
  BLAKE2B_CTX ctx;
  BLAKE2B256_Init(&ctx);
  BLAKE2B256_Update(&ctx, data, len);
  BLAKE2B256_Final(out, &ctx);
}